

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O1

wstring * __thiscall
mjs::(anonymous_namespace)::to_radix_string_inner_abi_cxx11_
          (wstring *__return_storage_ptr__,_anonymous_namespace_ *this,double x,int radix,
          bool int_part)

{
  int iVar1;
  double dVar2;
  double __y;
  wstring res;
  undefined4 *local_60;
  long local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 *local_40;
  undefined4 *local_38;
  
  if (0xffffffffffffe < (long)x - 1U &&
      ((long)x < 0 || 0x3fe < (uint)((long)ABS(x) + 0xfff0000000000000U >> 0x35))) {
    __assert_fail("std::isfinite(x) && x > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0x39,
                  "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                 );
  }
  local_58 = 0;
  local_50 = 0;
  __y = (double)(int)this;
  iVar1 = -0x44c;
  local_60 = &local_50;
  do {
    iVar1 = iVar1 + 1;
    if (iVar1 == 0) break;
    if ((char)radix == '\0') {
      if (1.0 < x) {
        __assert_fail("x <= 1.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                      ,0x47,
                      "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                     );
      }
      dVar2 = floor(x * __y);
      dVar2 = fmod(dVar2,__y);
      x = x * __y - dVar2;
    }
    else {
      dVar2 = floor(x);
      if (((x <= 0.0) || (x != dVar2)) || (NAN(x) || NAN(dVar2))) {
        __assert_fail("x > 0.0 && x == std::floor(x)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                      ,0x43,
                      "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                     );
      }
      dVar2 = fmod(x,__y);
      x = (x - dVar2) / __y;
    }
    if ((dVar2 < 0.0) || (__y <= dVar2)) {
      __assert_fail("rem >= 0 && rem < radix",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                    ,0x4d,
                    "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                   );
    }
    std::__cxx11::wstring::push_back((wchar_t)&local_60);
  } while ((x != 0.0) || (NAN(x)));
  if ((char)radix == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)__return_storage_ptr__,local_60,local_60 + local_58);
  }
  else {
    local_38 = local_60 + local_58;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_40 = local_60;
    std::__cxx11::wstring::
    _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>>
              ((wstring *)__return_storage_ptr__);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT44(uStack_4c,local_50) * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring to_radix_string_inner(double x, int radix, bool int_part) {
    assert(std::isfinite(x) && x > 0);
    constexpr const char digits[37] = "0123456789abcdefghijklmnopqrstuvwxyz";
    std::wstring res;
    int iter = 1100;
    do {
        if (!--iter) {
            break;
        }
        double rem, n;
        if (int_part) {
            assert(x > 0.0 && x == std::floor(x));
            rem = std::fmod(x, radix);
            n   = (x - rem) / radix;
        } else {
            assert(x <= 1.0);
            n = x*radix;
            rem = std::fmod(std::floor(n), radix);
            n -= rem;
        }

        assert(rem >= 0 && rem < radix);
        res += digits[static_cast<int>(rem)];
        x = n;

    } while (x != 0.0);

    return int_part ? std::wstring(res.crbegin(), res.crend()) : res;
}